

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

par_shapes_mesh * par_shapes_create_disk(float radius,int slices,float *center,float *normal)

{
  par_shapes_mesh *mesh_00;
  float *pfVar1;
  uint16_t *puVar2;
  long *in_FS_OFFSET;
  double dVar3;
  float local_10c [2];
  float axis [3];
  float k [3];
  int i_2;
  uint16_t *triangles;
  int local_b4;
  float *pfStack_b0;
  int i_1;
  float *norms;
  float local_74;
  float local_70;
  float nnormal [3];
  float theta;
  int i;
  float *points;
  par_shapes_mesh *mesh;
  float *normal_local;
  float *center_local;
  int slices_local;
  float radius_local;
  
  mesh_00 = (par_shapes_mesh *)rf_calloc_wrapper(*(rf_allocator *)(*in_FS_OFFSET + -0x440),1,0x30);
  mesh_00->npoints = slices + 1;
  pfVar1 = (float *)(**(code **)(*in_FS_OFFSET + -0x438))(*in_FS_OFFSET + -0x440,1);
  mesh_00->points = pfVar1;
  pfVar1 = mesh_00->points;
  *pfVar1 = 0.0;
  pfVar1[1] = 0.0;
  pfVar1[2] = 0.0;
  for (nnormal[2] = 0.0; _theta = pfVar1 + 3, (int)nnormal[2] < slices;
      nnormal[2] = (float)((int)nnormal[2] + 1)) {
    nnormal[1] = ((float)(int)nnormal[2] * 3.1415927 * 2.0) / (float)slices;
    dVar3 = cos((double)nnormal[1]);
    *_theta = (float)((double)radius * dVar3);
    dVar3 = sin((double)nnormal[1]);
    pfVar1[4] = (float)((double)radius * dVar3);
    pfVar1[5] = 0.0;
    pfVar1 = _theta;
  }
  local_74 = *normal;
  local_70 = normal[1];
  nnormal[0] = normal[2];
  par_shapes__normalize3(&local_74);
  pfVar1 = (float *)(**(code **)(*in_FS_OFFSET + -0x438))(*in_FS_OFFSET + -0x440,1);
  mesh_00->normals = pfVar1;
  pfStack_b0 = mesh_00->normals;
  for (local_b4 = 0; local_b4 < mesh_00->npoints; local_b4 = local_b4 + 1) {
    *pfStack_b0 = local_74;
    pfVar1 = pfStack_b0 + 2;
    pfStack_b0[1] = local_70;
    pfStack_b0 = pfStack_b0 + 3;
    *pfVar1 = nnormal[0];
  }
  mesh_00->ntriangles = slices;
  puVar2 = (uint16_t *)(**(code **)(*in_FS_OFFSET + -0x438))(*in_FS_OFFSET + -0x440,1);
  mesh_00->triangles = puVar2;
  unique0x00012000 = mesh_00->triangles;
  for (k[1] = 0.0; (int)k[1] < slices; k[1] = (float)((int)k[1] + 1)) {
    *stack0xffffffffffffff10 = 0;
    puVar2 = stack0xffffffffffffff10 + 2;
    stack0xffffffffffffff10[1] = SUB42(k[1],0) + 1;
    register0x00000010 = stack0xffffffffffffff10 + 3;
    *puVar2 = (short)(((int)k[1] + 1) % slices) + 1;
  }
  axis[1] = 0.0;
  axis[2] = 0.0;
  par_shapes__cross3(local_10c,&local_74,axis + 1);
  par_shapes__normalize3(local_10c);
  dVar3 = acos((double)nnormal[0]);
  par_shapes_rotate(mesh_00,(float)dVar3,local_10c);
  par_shapes_translate(mesh_00,*center,center[1],center[2]);
  return mesh_00;
}

Assistant:

PARDEF par_shapes_mesh* par_shapes_create_disk(float radius, int slices,
                                        float const* center, float const* normal)
{
    par_shapes_mesh* mesh = PAR_CALLOC(par_shapes_mesh, 1);
    mesh->npoints = slices + 1;
    mesh->points = PAR_MALLOC(float, 3 * mesh->npoints);
    float* points = mesh->points;
    *points++ = 0;
    *points++ = 0;
    *points++ = 0;
    for (int i = 0; i < slices; i++) {
        float theta = i * PAR_PI * 2 / slices;
        *points++ = radius * cos(theta);
        *points++ = radius * sin(theta);
        *points++ = 0;
    }
    float nnormal[3] = {normal[0], normal[1], normal[2]};
    par_shapes__normalize3(nnormal);
    mesh->normals = PAR_MALLOC(float, 3 * mesh->npoints);
    float* norms = mesh->normals;
    for (int i = 0; i < mesh->npoints; i++) {
        *norms++ = nnormal[0];
        *norms++ = nnormal[1];
        *norms++ = nnormal[2];
    }
    mesh->ntriangles = slices;
    mesh->triangles = PAR_MALLOC(PAR_SHAPES_T, 3 * mesh->ntriangles);
    PAR_SHAPES_T* triangles = mesh->triangles;
    for (int i = 0; i < slices; i++) {
        *triangles++ = 0;
        *triangles++ = 1 + i;
        *triangles++ = 1 + (i + 1) % slices;
    }
    float k[3] = {0, 0, -1};
    float axis[3];
    par_shapes__cross3(axis, nnormal, k);
    par_shapes__normalize3(axis);
    par_shapes_rotate(mesh, acos(nnormal[2]), axis);
    par_shapes_translate(mesh, center[0], center[1], center[2]);
    return mesh;
}